

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MFParallelForC.H
# Opt level: O0

enable_if_t<IsFabArray<MultiFab>::value>
amrex::experimental::detail::ParallelFor<amrex::MultiFab,PeleLM::init(amrex::AmrLevel&)::__0>
          (MultiFab *mf,IntVect *nghost,IntVect *ts,bool dynamic,anon_class_32_4_e9619941 *f)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  int box_no;
  int k_00;
  MFItInfo *this;
  byte in_CL;
  IntVect *in_RDX;
  MFItInfo *in_RDI;
  anon_class_32_4_e9619941 *in_R8;
  int i;
  int j;
  int k;
  Dim3 hi;
  Dim3 lo;
  int lidx;
  Box *bx;
  MFIter mfi;
  MFIter *in_stack_fffffffffffffe30;
  int local_1b4;
  undefined4 in_stack_fffffffffffffe50;
  int j_00;
  undefined4 in_stack_fffffffffffffe54;
  FabArrayBase *in_stack_fffffffffffffe58;
  undefined4 in_stack_fffffffffffffe60;
  undefined4 in_stack_fffffffffffffe64;
  undefined4 in_stack_fffffffffffffe68;
  int in_stack_fffffffffffffe6c;
  int in_stack_fffffffffffffe70;
  int in_stack_fffffffffffffe74;
  undefined1 local_164 [40];
  MFItInfo local_13c;
  MFIter local_128;
  anon_class_32_4_e9619941 *local_c8;
  byte local_b9;
  IntVect *local_b8;
  FabArrayBase *local_a0;
  int local_98;
  MFIter *local_90;
  int local_88;
  int iStack_84;
  int local_80;
  undefined4 local_7c;
  MFIter *local_78;
  undefined4 local_6c;
  MFIter *local_68;
  undefined4 local_5c;
  MFIter *local_58;
  undefined8 local_50;
  int local_48;
  MFIter *local_40;
  int local_38;
  int iStack_34;
  int local_30;
  undefined4 local_2c;
  undefined1 *local_28;
  undefined4 local_1c;
  undefined1 *local_18;
  undefined4 local_c;
  int *local_8;
  
  local_b9 = in_CL & 1;
  local_c8 = in_R8;
  local_b8 = in_RDX;
  MFItInfo::MFItInfo(in_RDI);
  this = MFItInfo::EnableTiling(&local_13c,local_b8);
  MFItInfo::SetDynamic(this,(bool)(local_b9 & 1));
  MFIter::MFIter((MFIter *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                 in_stack_fffffffffffffe58,
                 (MFItInfo *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50));
  while (bVar3 = MFIter::isValid(&local_128), bVar3) {
    in_stack_fffffffffffffe30 = (MFIter *)local_164;
    MFIter::growntilebox
              ((MFIter *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
               (IntVect *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
    local_164._28_8_ = in_stack_fffffffffffffe30;
    box_no = MFIter::LocalIndex(in_stack_fffffffffffffe30);
    local_90 = (MFIter *)local_164._28_8_;
    local_58 = (MFIter *)local_164._28_8_;
    local_5c = 0;
    iVar1 = *(int *)&(((unique_ptr<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_> *
                       )local_164._28_8_)->_M_t).
                     super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                     .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl;
    local_68 = (MFIter *)local_164._28_8_;
    local_6c = 1;
    iVar2 = *(int *)((long)&(((unique_ptr<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                               *)local_164._28_8_)->_M_t).
                            super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                            .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl + 4);
    local_a0 = (((unique_ptr<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_> *)
                local_164._28_8_)->_M_t).
               super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
               ._M_t.
               super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
               .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl;
    local_78 = (MFIter *)local_164._28_8_;
    local_7c = 2;
    k_00 = *(int *)(local_164._28_8_ + 8);
    local_40 = (MFIter *)local_164._28_8_;
    local_8 = (int *)((long)(local_164._28_8_ + 8) + 4);
    local_c = 0;
    in_stack_fffffffffffffe6c = *local_8;
    local_18 = (undefined1 *)((long)(local_164._28_8_ + 8) + 4);
    local_1c = 1;
    in_stack_fffffffffffffe70 = ((IntVect *)(local_164._28_8_ + 0x10))->vect[0];
    local_50 = *(undefined8 *)local_8;
    local_28 = (undefined1 *)((long)(local_164._28_8_ + 8) + 4);
    local_2c = 2;
    in_stack_fffffffffffffe74 = ((IntVect *)(local_164._28_8_ + 0x10))->vect[1];
    local_98 = k_00;
    local_88 = iVar1;
    iStack_84 = iVar2;
    local_80 = k_00;
    local_48 = in_stack_fffffffffffffe74;
    local_38 = in_stack_fffffffffffffe6c;
    iStack_34 = in_stack_fffffffffffffe70;
    local_30 = in_stack_fffffffffffffe74;
    for (; j_00 = iVar2, k_00 <= in_stack_fffffffffffffe74; k_00 = k_00 + 1) {
      for (; local_1b4 = iVar1, j_00 <= in_stack_fffffffffffffe70; j_00 = j_00 + 1) {
        for (; local_1b4 <= in_stack_fffffffffffffe6c; local_1b4 = local_1b4 + 1) {
          PeleLM::init::anon_class_32_4_e9619941::operator()(local_c8,box_no,local_1b4,j_00,k_00);
        }
      }
    }
    MFIter::operator++(&local_128);
  }
  MFIter::~MFIter(in_stack_fffffffffffffe30);
  return;
}

Assistant:

std::enable_if_t<IsFabArray<MF>::value>
ParallelFor (MF const& mf, IntVect const& nghost, IntVect const& ts, bool dynamic, F&& f)
{
#ifdef AMREX_USE_OMP
#pragma omp parallel
#endif
    for (MFIter mfi(mf,MFItInfo().EnableTiling(ts).SetDynamic(dynamic)); mfi.isValid(); ++mfi) {
        Box const& bx = mfi.growntilebox(nghost);
        int const lidx = mfi.LocalIndex();
        const auto lo = amrex::lbound(bx);
        const auto hi = amrex::ubound(bx);
        for (        int k = lo.z; k <= hi.z; ++k) {
            for (    int j = lo.y; j <= hi.y; ++j) {
                AMREX_PRAGMA_SIMD
                for (int i = lo.x; i <= hi.x; ++i) {
                    f(lidx,i,j,k);
                }
            }
        }
    }
}